

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M2Data.cpp
# Opt level: O0

bool __thiscall M2Data::parse_file_name(M2Data *this,char *monthly_csv_file_name)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  int local_74;
  char c_2;
  int i_4;
  char c_1;
  int i_3;
  size_t ml;
  int i_2;
  char c;
  int i_1;
  size_t sl;
  int local_40;
  int i;
  int suffix_len;
  int d;
  int m;
  int y;
  size_t char_index;
  size_t len;
  bool ret;
  char *monthly_csv_file_name_local;
  M2Data *this_local;
  
  sVar4 = strlen(monthly_csv_file_name);
  _m = 0;
  d = 0;
  suffix_len = 0;
  i = 0;
  local_40 = 0;
  if (sVar4 < 4) {
    bVar7 = false;
  }
  else {
    for (sl._4_4_ = 0; sl._4_4_ < 3; sl._4_4_ = sl._4_4_ + 1) {
      sVar5 = strlen(file_suffix[sl._4_4_]);
      if ((sVar5 < sVar4) &&
         (iVar3 = strcmp(monthly_csv_file_name + (sVar4 - sVar5),file_suffix[sl._4_4_]), iVar3 == 0)
         ) {
        this->M2Type = file_type[sl._4_4_];
        local_40 = (int)sVar5;
        break;
      }
    }
    bVar7 = this->M2Type != UnknownM2Type;
    for (i_2 = 0; bVar7 != false && i_2 < 4; i_2 = i_2 + 1) {
      cVar2 = monthly_csv_file_name[_m];
      if ((cVar2 < '0') || ('9' < cVar2)) {
        bVar7 = false;
      }
      else {
        d = cVar2 + -0x30 + d * 10;
      }
      _m = _m + 1;
    }
    if ((d < 0x7e1) || (0x809 < d)) {
      bVar7 = false;
    }
  }
  if ((bVar7 != false) &&
     (lVar6 = _m + 1, pcVar1 = monthly_csv_file_name + _m, _m = lVar6, *pcVar1 != '-')) {
    bVar7 = false;
  }
  if (bVar7 != false) {
    if (this->M2Type == TLD_old) {
      for (ml._4_4_ = 0; ml._4_4_ < 0xc; ml._4_4_ = ml._4_4_ + 1) {
        sVar5 = strlen(month_names[ml._4_4_]);
        if ((_m + sVar5 < sVar4) &&
           (iVar3 = strncmp(monthly_csv_file_name + _m,month_names[ml._4_4_],sVar5), iVar3 == 0)) {
          suffix_len = ml._4_4_ + 1;
          _m = sVar5 + _m;
          break;
        }
      }
      if (suffix_len < 1) {
        bVar7 = false;
      }
      else {
        i = month_day[suffix_len + -1];
      }
    }
    else {
      for (i_4 = 0; bVar7 != false && i_4 < 2; i_4 = i_4 + 1) {
        cVar2 = monthly_csv_file_name[_m];
        if ((cVar2 < '0') || ('9' < cVar2)) {
          bVar7 = false;
        }
        else {
          suffix_len = cVar2 + -0x30 + suffix_len * 10;
        }
        _m = _m + 1;
      }
      if ((suffix_len < 1) || (0xc < suffix_len)) {
        bVar7 = false;
      }
      if ((bVar7 != false) &&
         (lVar6 = _m + 1, pcVar1 = monthly_csv_file_name + _m, _m = lVar6, *pcVar1 != '-')) {
        bVar7 = false;
      }
      for (local_74 = 0; bVar7 != false && local_74 < 2; local_74 = local_74 + 1) {
        cVar2 = monthly_csv_file_name[_m];
        if ((cVar2 < '0') || ('9' < cVar2)) {
          bVar7 = false;
        }
        else {
          i = cVar2 + -0x30 + i * 10;
        }
        _m = _m + 1;
      }
      if ((i < 1) || (0x1f < i)) {
        bVar7 = false;
      }
    }
  }
  if ((bVar7 != false) && (_m + local_40 != sVar4)) {
    bVar7 = false;
  }
  if (bVar7 != false) {
    this->year = d;
    this->month = suffix_len;
    this->day = i;
  }
  return bVar7;
}

Assistant:

bool M2Data::parse_file_name(char const * monthly_csv_file_name)
{
    bool ret = true;
    size_t len = strlen(monthly_csv_file_name);
    size_t char_index = 0;
    int y = 0;
    int m = 0;
    int d = 0;
    int suffix_len = 0;

    if (len < 4)
    {
        ret = false;
    }
    else
    {
        for (int i = 0; i < 3; i++)
        {
            size_t sl = strlen(file_suffix[i]);
            if (sl < len && strcmp(monthly_csv_file_name + len - sl, file_suffix[i]) == 0)
            {
                M2Type = file_type[i];
                suffix_len = (int) sl;
                break;
            }
        }

        if (M2Type == UnknownM2Type)
        {
            ret = false;
        }

        for (int i = 0; ret && i < 4; i++)
        {
            char c = monthly_csv_file_name[char_index++];

            if (c < '0' || c > '9')
            {
                ret = false;
            }
            else
            {
                y *= 10;
                y += c - '0';
            }
        }

        if (y < 2017 || y > 2057)
        {
            ret = false;
        }
    }

    if (ret && monthly_csv_file_name[char_index++] != '-')
    {
        ret = false;
    }

    if (ret)
    {
        if (M2Type == TLD_old)
        {
            for (int i = 0; i < 12; i++)
            {
                size_t ml = strlen(month_names[i]);
                if ((char_index + ml) < len &&
                    strncmp(&monthly_csv_file_name[char_index], month_names[i], ml) == 0)
                {
                    m = i+1;
                    char_index += ml;
                    break;
                }
            }


            if (m <= 0)
            {
                ret = false;
            }
            else
            {
                d = month_day[m-1];
            }
        }
        else
        {
            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    m *= 10;
                    m += c - '0';
                }
            }

            if (m <= 0 || m > 12)
            {
                ret = false;
            }

            if (ret && monthly_csv_file_name[char_index++] != '-')
            {
                ret = false;
            }

            for (int i = 0; ret && i < 2; i++)
            {
                char c = monthly_csv_file_name[char_index++];

                if (c < '0' || c > '9')
                {
                    ret = false;
                }
                else
                {
                    d *= 10;
                    d += c - '0';
                }
            }

            if (d <= 0 || d > 31)
            {
                ret = false;
            }
        }
    }

    if (ret && char_index+suffix_len != len)
    {
        ret = false;
    }

    if (ret)
    {
        year = y;
        month = m;
        day = d;
    }

    return ret;
}